

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O1

int __thiscall AliHttpRequest::WaitResponseHeaderComplete(AliHttpRequest *this)

{
  uint uVar1;
  char Read_buf [4096];
  char acStack_1028 [4104];
  
  memset(acStack_1028,0,0x1000);
  http_parser_init_(this->parser_,HTTP_RESPONSE);
  this->parser_->data = this;
  while( true ) {
    memset(acStack_1028,0,0x1000);
    uVar1 = (*this->connection_->_vptr_AliConnection[2])(this->connection_,acStack_1028,0x1000);
    if ((int)uVar1 < 0) {
      return -1;
    }
    http_parser_execute_(this->parser_,&htp_hooks,acStack_1028,(ulong)uVar1);
    if ((this->parser_->field_0x17 & 0x7f) != 0) break;
    if (this->is_response_header_complete == true) {
      return this->response_status_code_;
    }
  }
  return -1;
}

Assistant:

int AliHttpRequest::WaitResponseHeaderComplete() {
  char Read_buf[4096] = {};
  int last_Read = 0;
  http_parser_init_(parser_, HTTP_RESPONSE);
  parser_->data = this;

  do{
    memset(Read_buf, 0, sizeof(Read_buf));
    last_Read = this->connection_->Read(Read_buf, sizeof(Read_buf));
    if(last_Read < 0) {
      break;
    }
    http_parser_execute_(parser_, &htp_hooks, Read_buf, last_Read);

    if(parser_->http_errno != 0) {
      return -1;
    }
  } while(!is_response_header_complete);
  
  if(last_Read < 0) {
    return -1;
  }

  return this->response_status_code_;
}